

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86_avx512::forward_inplace(UnaryOp_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  ulong uVar2;
  undefined1 auVar3 [32];
  float afVar4 [16];
  ulong uVar5;
  Option *extraout_RDX;
  Option *extraout_RDX_00;
  Option *extraout_RDX_01;
  Option *extraout_RDX_02;
  Option *extraout_RDX_03;
  Option *extraout_RDX_04;
  Option *extraout_RDX_05;
  Option *extraout_RDX_06;
  ulong uVar6;
  Option *extraout_RDX_07;
  Option *extraout_RDX_08;
  Option *extraout_RDX_09;
  Option *extraout_RDX_10;
  float *pfVar7;
  undefined1 (*pauVar8) [64];
  int iVar9;
  int iVar10;
  undefined1 auVar14 [32];
  undefined1 auVar12 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  float fVar23;
  undefined1 auVar24 [16];
  __m512 afVar25;
  undefined1 auVar28 [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar41 [64];
  undefined1 in_XMM15 [16];
  __m128 afVar42;
  unary_op_tanh op;
  unary_op_tanh local_d9;
  ulong local_d8;
  ulong local_d0;
  Mat *local_c8;
  __m512 local_c0 [2];
  undefined1 auVar11 [16];
  undefined1 auVar13 [32];
  
  afVar4 = _ps512_1;
  local_c8 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_avx512[-3])) {
  case 0:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar6 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar6;
    }
    auVar15 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        auVar16 = vandps_avx512dq(auVar15,*pauVar8);
        *pauVar8 = auVar16;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])*pauVar8;
        auVar32._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
        auVar32._8_4_ = auVar13._8_4_ ^ 0x80000000;
        auVar32._12_4_ = auVar13._12_4_ ^ 0x80000000;
        auVar32._16_4_ = auVar13._16_4_ ^ 0x80000000;
        auVar32._20_4_ = auVar13._20_4_ ^ 0x80000000;
        auVar32._24_4_ = auVar13._24_4_ ^ 0x80000000;
        auVar32._28_4_ = auVar13._28_4_ ^ 0x80000000;
        auVar13 = vmaxps_avx(auVar32,auVar13);
        *(undefined1 (*) [32])*pauVar8 = auVar13;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        auVar11 = vandps_avx(auVar29,*(undefined1 (*) [16])*pauVar8);
        *(undefined1 (*) [16])*pauVar8 = auVar11;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        auVar11 = vandps_avx(ZEXT416(*(uint *)*pauVar8),auVar29);
        *(int *)*pauVar8 = auVar11._0_4_;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 1:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar6 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar6;
    }
    auVar15 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        auVar16 = vxorps_avx512dq(auVar15,*pauVar8);
        *pauVar8 = auVar16;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])*pauVar8;
        auVar31._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
        auVar31._8_4_ = auVar13._8_4_ ^ 0x80000000;
        auVar31._12_4_ = auVar13._12_4_ ^ 0x80000000;
        auVar31._16_4_ = auVar13._16_4_ ^ 0x80000000;
        auVar31._20_4_ = auVar13._20_4_ ^ 0x80000000;
        auVar31._24_4_ = auVar13._24_4_ ^ 0x80000000;
        auVar31._28_4_ = auVar13._28_4_ ^ 0x80000000;
        *(undefined1 (*) [32])*pauVar8 = auVar31;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        auVar11 = *(undefined1 (*) [16])*pauVar8;
        auVar30._0_8_ = auVar11._0_8_ ^ 0x8000000080000000;
        auVar30._8_4_ = auVar11._8_4_ ^ 0x80000000;
        auVar30._12_4_ = auVar11._12_4_ ^ 0x80000000;
        *(undefined1 (*) [16])*pauVar8 = auVar30;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        *(uint *)*pauVar8 = *(uint *)*pauVar8 ^ 0x80000000;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 2:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar6 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        auVar15 = vrndscaleps_avx512f(*pauVar8,1);
        *pauVar8 = auVar15;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = vroundps_avx(*(undefined1 (*) [32])*pauVar8,1);
        *(undefined1 (*) [32])*pauVar8 = auVar13;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        auVar11 = vroundps_avx(*(undefined1 (*) [16])*pauVar8,1);
        *(undefined1 (*) [16])*pauVar8 = auVar11;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        auVar11 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)*pauVar8),9);
        *(int *)*pauVar8 = auVar11._0_4_;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 3:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar6 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        auVar15 = vrndscaleps_avx512f(*pauVar8,2);
        *pauVar8 = auVar15;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = vroundps_avx(*(undefined1 (*) [32])*pauVar8,2);
        *(undefined1 (*) [32])*pauVar8 = auVar13;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        auVar11 = vroundps_avx(*(undefined1 (*) [16])*pauVar8,2);
        *(undefined1 (*) [16])*pauVar8 = auVar11;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        auVar11 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)*pauVar8),10);
        *(int *)*pauVar8 = auVar11._0_4_;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 4:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar6 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        auVar15 = vmulps_avx512f(*pauVar8,*pauVar8);
        *pauVar8 = auVar15;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar3._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar8 + 4);
        auVar3._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar8;
        auVar3._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar8 + 8);
        auVar3._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar8 + 0xc);
        auVar3._16_4_ = *(float *)(*pauVar8 + 0x10) * *(float *)(*pauVar8 + 0x10);
        auVar3._20_4_ = *(float *)(*pauVar8 + 0x14) * *(float *)(*pauVar8 + 0x14);
        auVar3._24_4_ = *(float *)(*pauVar8 + 0x18) * *(float *)(*pauVar8 + 0x18);
        auVar3._28_4_ = *(undefined4 *)(*pauVar8 + 0x1c);
        *(undefined1 (*) [32])*pauVar8 = auVar3;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        auVar24._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar8;
        auVar24._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar8 + 4);
        auVar24._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar8 + 8);
        auVar24._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar8 + 0xc);
        *(undefined1 (*) [16])*pauVar8 = auVar24;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        *(float *)*pauVar8 = *(float *)*pauVar8 * *(float *)*pauVar8;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 5:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar6 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar6;
    }
    auVar15 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
    auVar16 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
    auVar17 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
    auVar18 = vbroadcastss_avx512f(ZEXT416(0x800000));
    auVar33._8_4_ = 0xc0400000;
    auVar33._0_8_ = 0xc0400000c0400000;
    auVar33._12_4_ = 0xc0400000;
    auVar33._16_4_ = 0xc0400000;
    auVar33._20_4_ = 0xc0400000;
    auVar33._24_4_ = 0xc0400000;
    auVar33._28_4_ = 0xc0400000;
    auVar34._8_4_ = 0x7fffffff;
    auVar34._0_8_ = 0x7fffffff7fffffff;
    auVar34._12_4_ = 0x7fffffff;
    auVar34._16_4_ = 0x7fffffff;
    auVar34._20_4_ = 0x7fffffff;
    auVar34._24_4_ = 0x7fffffff;
    auVar34._28_4_ = 0x7fffffff;
    auVar35._8_4_ = 0x800000;
    auVar35._0_8_ = 0x80000000800000;
    auVar35._12_4_ = 0x800000;
    auVar35._16_4_ = 0x800000;
    auVar35._20_4_ = 0x800000;
    auVar35._24_4_ = 0x800000;
    auVar35._28_4_ = 0x800000;
    auVar36._8_4_ = 0xc0400000;
    auVar36._0_8_ = 0xc0400000c0400000;
    auVar36._12_4_ = 0xc0400000;
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar38._8_4_ = 0x800000;
    auVar38._0_8_ = 0x80000000800000;
    auVar38._12_4_ = 0x800000;
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        auVar21 = *pauVar8;
        auVar19 = vrsqrt14ps_avx512f(auVar21);
        auVar20 = vmulps_avx512f(auVar21,auVar19);
        auVar19 = vfmadd213ps_avx512f(auVar19,auVar20,auVar15);
        in_ZMM14 = vmulps_avx512f(auVar20,auVar16);
        auVar21 = vandps_avx512dq(auVar21,auVar17);
        uVar2 = vcmpps_avx512f(auVar21,auVar18,0xd);
        auVar21 = vmulps_avx512f(in_ZMM14,auVar19);
        auVar22._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar21._4_4_;
        auVar22._0_4_ = (uint)((byte)uVar2 & 1) * auVar21._0_4_;
        auVar22._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * auVar21._8_4_;
        auVar22._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * auVar21._12_4_;
        auVar22._16_4_ = (uint)((byte)(uVar2 >> 4) & 1) * auVar21._16_4_;
        auVar22._20_4_ = (uint)((byte)(uVar2 >> 5) & 1) * auVar21._20_4_;
        auVar22._24_4_ = (uint)((byte)(uVar2 >> 6) & 1) * auVar21._24_4_;
        auVar22._28_4_ = (uint)((byte)(uVar2 >> 7) & 1) * auVar21._28_4_;
        auVar22._32_4_ = (uint)((byte)(uVar2 >> 8) & 1) * auVar21._32_4_;
        auVar22._36_4_ = (uint)((byte)(uVar2 >> 9) & 1) * auVar21._36_4_;
        auVar22._40_4_ = (uint)((byte)(uVar2 >> 10) & 1) * auVar21._40_4_;
        auVar22._44_4_ = (uint)((byte)(uVar2 >> 0xb) & 1) * auVar21._44_4_;
        auVar22._48_4_ = (uint)((byte)(uVar2 >> 0xc) & 1) * auVar21._48_4_;
        auVar22._52_4_ = (uint)((byte)(uVar2 >> 0xd) & 1) * auVar21._52_4_;
        auVar22._56_4_ = (uint)((byte)(uVar2 >> 0xe) & 1) * auVar21._56_4_;
        auVar22._60_4_ = (uint)(byte)(uVar2 >> 0xf) * auVar21._60_4_;
        *pauVar8 = auVar22;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])*pauVar8;
        auVar1 = vrsqrtps_avx(auVar13);
        auVar41._0_4_ = auVar13._0_4_ * auVar1._0_4_;
        auVar41._4_4_ = auVar13._4_4_ * auVar1._4_4_;
        auVar41._8_4_ = auVar13._8_4_ * auVar1._8_4_;
        auVar41._12_4_ = auVar13._12_4_ * auVar1._12_4_;
        auVar41._16_4_ = auVar13._16_4_ * auVar1._16_4_;
        auVar41._20_4_ = auVar13._20_4_ * auVar1._20_4_;
        auVar41._28_36_ = in_ZMM14._28_36_;
        auVar41._24_4_ = auVar13._24_4_ * auVar1._24_4_;
        auVar11 = vfmadd213ps_fma(auVar1,auVar41._0_32_,auVar33);
        auVar1._4_4_ = auVar41._4_4_ * -0.5;
        auVar1._0_4_ = auVar41._0_4_ * -0.5;
        auVar1._8_4_ = auVar41._8_4_ * -0.5;
        auVar1._12_4_ = auVar41._12_4_ * -0.5;
        auVar1._16_4_ = auVar41._16_4_ * -0.5;
        auVar1._20_4_ = auVar41._20_4_ * -0.5;
        auVar1._24_4_ = auVar41._24_4_ * -0.5;
        auVar1._28_4_ = in_ZMM14._28_4_;
        in_ZMM14 = ZEXT3264(auVar1);
        auVar13 = vandps_avx(auVar13,auVar34);
        uVar2 = vcmpps_avx512vl(auVar13,auVar35,0xd);
        auVar13 = vmulps_avx512vl(auVar1,ZEXT1632(auVar11));
        auVar14._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar13._4_4_;
        auVar14._0_4_ = (uint)((byte)uVar2 & 1) * auVar13._0_4_;
        auVar14._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * auVar13._8_4_;
        auVar14._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * auVar13._12_4_;
        auVar14._16_4_ = (uint)((byte)(uVar2 >> 4) & 1) * auVar13._16_4_;
        auVar14._20_4_ = (uint)((byte)(uVar2 >> 5) & 1) * auVar13._20_4_;
        auVar14._24_4_ = (uint)((byte)(uVar2 >> 6) & 1) * auVar13._24_4_;
        auVar14._28_4_ = (uint)(byte)(uVar2 >> 7) * auVar13._28_4_;
        *(undefined1 (*) [32])*pauVar8 = auVar14;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        auVar11 = *(undefined1 (*) [16])*pauVar8;
        auVar12 = vrsqrtps_avx(auVar11);
        auVar39._0_4_ = auVar11._0_4_ * auVar12._0_4_;
        auVar39._4_4_ = auVar11._4_4_ * auVar12._4_4_;
        auVar39._8_4_ = auVar11._8_4_ * auVar12._8_4_;
        auVar39._12_4_ = auVar11._12_4_ * auVar12._12_4_;
        auVar12 = vfmadd213ps_fma(auVar12,auVar39,auVar36);
        auVar40._0_4_ = auVar39._0_4_ * -0.5;
        auVar40._4_4_ = auVar39._4_4_ * -0.5;
        auVar40._8_4_ = auVar39._8_4_ * -0.5;
        auVar40._12_4_ = auVar39._12_4_ * -0.5;
        in_ZMM14 = ZEXT1664(auVar40);
        auVar11 = vandps_avx(auVar11,auVar37);
        uVar2 = vcmpps_avx512vl(auVar11,auVar38,0xd);
        auVar11 = vmulps_avx512vl(auVar40,auVar12);
        auVar12._4_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar11._4_4_;
        auVar12._0_4_ = (uint)((byte)uVar2 & 1) * auVar11._0_4_;
        auVar12._8_4_ = (uint)((byte)(uVar2 >> 2) & 1) * auVar11._8_4_;
        auVar12._12_4_ = (uint)((byte)(uVar2 >> 3) & 1) * auVar11._12_4_;
        *(undefined1 (*) [16])*pauVar8 = auVar12;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        auVar11 = vsqrtss_avx(in_XMM15,ZEXT416(*(uint *)*pauVar8));
        *(int *)*pauVar8 = auVar11._0_4_;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 6:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar6 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        auVar13 = vrsqrtps_avx(*(undefined1 (*) [32])*pauVar8);
        auVar33 = vrsqrtps_avx(*(undefined1 (*) [32])((long)*pauVar8 + 0x20));
        auVar15 = vinsertf64x4_avx512f(ZEXT3264(auVar13),auVar33,1);
        *pauVar8 = auVar15;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = vrsqrtps_avx(*(undefined1 (*) [32])*pauVar8);
        *(undefined1 (*) [32])*pauVar8 = auVar13;
        pauVar8 = (undefined1 (*) [64])((long)*pauVar8 + 0x20);
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        auVar11 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar8);
        *(undefined1 (*) [16])*pauVar8 = auVar11;
        pauVar8 = (undefined1 (*) [64])((long)*pauVar8 + 0x10);
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = *(float *)*pauVar8;
        auVar11 = vrsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
        auVar36 = vfmadd213ss_fma(ZEXT416((uint)(fVar23 * auVar11._0_4_)),auVar11,
                                  SUB6416(ZEXT464(0xc0400000),0));
        *(float *)*pauVar8 = auVar11._0_4_ * -0.5 * auVar36._0_4_;
        pauVar8 = (undefined1 (*) [64])((long)*pauVar8 + 4);
      }
    }
    break;
  case 7:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_d0 = 0;
    local_d8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_d8 = local_d0;
    }
    for (; local_d0 != local_d8; local_d0 = local_d0 + 1) {
      pfVar7 = (float *)(local_c8->cstep * local_d0 * local_c8->elemsize + (long)local_c8->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        afVar25 = *(__m512 *)pfVar7;
        local_c0[0] = afVar25;
        UnaryOp_x86_avx512_functor::unary_op_exp::func_pack16((unary_op_exp *)&local_d9,local_c0);
        *(__m512 *)pfVar7 = afVar25;
        pfVar7 = pfVar7 + 0x10;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])pfVar7;
        local_c0[0][0] = (float)auVar13._0_4_;
        local_c0[0][1] = (float)auVar13._4_4_;
        local_c0[0][2] = (float)auVar13._8_4_;
        local_c0[0][3] = (float)auVar13._12_4_;
        local_c0[0][4] = (float)auVar13._16_4_;
        local_c0[0][5] = (float)auVar13._20_4_;
        local_c0[0][6] = (float)auVar13._24_4_;
        local_c0[0][7] = (float)auVar13._28_4_;
        UnaryOp_x86_avx512_functor::unary_op_exp::func_pack8
                  ((unary_op_exp *)&local_d9,(__m256 *)local_c0);
        *(undefined1 (*) [32])pfVar7 = auVar13;
        pfVar7 = pfVar7 + 8;
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        local_c0[0]._0_16_ = *(undefined1 (*) [16])pfVar7;
        auVar28 = ZEXT856(*(ulong *)(pfVar7 + 2));
        afVar42 = UnaryOp_x86_avx512_functor::unary_op_exp::func_pack4
                            ((unary_op_exp *)&local_d9,(__m128 *)local_c0);
        auVar26._0_8_ = afVar42._0_8_;
        auVar26._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar7 = auVar26._0_16_;
        pfVar7 = pfVar7 + 4;
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = expf(*pfVar7);
        *pfVar7 = fVar23;
        pfVar7 = pfVar7 + 1;
      }
    }
    break;
  case 8:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_d0 = 0;
    local_d8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_d8 = local_d0;
    }
    for (; local_d0 != local_d8; local_d0 = local_d0 + 1) {
      pfVar7 = (float *)(local_c8->cstep * local_d0 * local_c8->elemsize + (long)local_c8->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        afVar25 = *(__m512 *)pfVar7;
        local_c0[0] = afVar25;
        UnaryOp_x86_avx512_functor::unary_op_log::func_pack16((unary_op_log *)&local_d9,local_c0);
        *(__m512 *)pfVar7 = afVar25;
        pfVar7 = pfVar7 + 0x10;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])pfVar7;
        local_c0[0][0] = (float)auVar13._0_4_;
        local_c0[0][1] = (float)auVar13._4_4_;
        local_c0[0][2] = (float)auVar13._8_4_;
        local_c0[0][3] = (float)auVar13._12_4_;
        local_c0[0][4] = (float)auVar13._16_4_;
        local_c0[0][5] = (float)auVar13._20_4_;
        local_c0[0][6] = (float)auVar13._24_4_;
        local_c0[0][7] = (float)auVar13._28_4_;
        UnaryOp_x86_avx512_functor::unary_op_log::func_pack8
                  ((unary_op_log *)&local_d9,(__m256 *)local_c0);
        *(undefined1 (*) [32])pfVar7 = auVar13;
        pfVar7 = pfVar7 + 8;
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        local_c0[0]._0_16_ = *(undefined1 (*) [16])pfVar7;
        auVar28 = ZEXT856(*(ulong *)(pfVar7 + 2));
        afVar42 = UnaryOp_x86_avx512_functor::unary_op_log::func_pack4
                            ((unary_op_log *)&local_d9,(__m128 *)local_c0);
        auVar27._0_8_ = afVar42._0_8_;
        auVar27._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar7 = auVar27._0_16_;
        pfVar7 = pfVar7 + 4;
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = logf(*pfVar7);
        *pfVar7 = fVar23;
        pfVar7 = pfVar7 + 1;
      }
    }
    break;
  case 9:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_d0 = 0;
    local_d8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_d8 = local_d0;
    }
    for (; local_d0 != local_d8; local_d0 = local_d0 + 1) {
      pfVar7 = (float *)(local_c8->cstep * local_d0 * local_c8->elemsize + (long)local_c8->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        afVar25 = *(__m512 *)pfVar7;
        local_c0[0] = afVar25;
        UnaryOp_x86_avx512_functor::unary_op_sin::func_pack16((unary_op_sin *)&local_d9,local_c0);
        *(__m512 *)pfVar7 = afVar25;
        pfVar7 = pfVar7 + 0x10;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])pfVar7;
        local_c0[0][0] = (float)auVar13._0_4_;
        local_c0[0][1] = (float)auVar13._4_4_;
        local_c0[0][2] = (float)auVar13._8_4_;
        local_c0[0][3] = (float)auVar13._12_4_;
        local_c0[0][4] = (float)auVar13._16_4_;
        local_c0[0][5] = (float)auVar13._20_4_;
        local_c0[0][6] = (float)auVar13._24_4_;
        local_c0[0][7] = (float)auVar13._28_4_;
        UnaryOp_x86_avx512_functor::unary_op_sin::func_pack8
                  ((unary_op_sin *)&local_d9,(__m256 *)local_c0);
        *(undefined1 (*) [32])pfVar7 = auVar13;
        pfVar7 = pfVar7 + 8;
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        local_c0[0]._0_16_ = *(undefined1 (*) [16])pfVar7;
        auVar28 = ZEXT856(*(ulong *)(pfVar7 + 2));
        afVar42 = UnaryOp_x86_avx512_functor::unary_op_sin::func_pack4
                            ((unary_op_sin *)&local_d9,(__m128 *)local_c0);
        auVar20._0_8_ = afVar42._0_8_;
        auVar20._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar7 = auVar20._0_16_;
        pfVar7 = pfVar7 + 4;
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = sinf(*pfVar7);
        *pfVar7 = fVar23;
        pfVar7 = pfVar7 + 1;
      }
    }
    break;
  case 10:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_d0 = 0;
    local_d8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_d8 = local_d0;
    }
    for (; local_d0 != local_d8; local_d0 = local_d0 + 1) {
      pfVar7 = (float *)(local_c8->cstep * local_d0 * local_c8->elemsize + (long)local_c8->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        afVar25 = *(__m512 *)pfVar7;
        local_c0[0] = afVar25;
        UnaryOp_x86_avx512_functor::unary_op_cos::func_pack16((unary_op_cos *)&local_d9,local_c0);
        *(__m512 *)pfVar7 = afVar25;
        pfVar7 = pfVar7 + 0x10;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])pfVar7;
        local_c0[0][0] = (float)auVar13._0_4_;
        local_c0[0][1] = (float)auVar13._4_4_;
        local_c0[0][2] = (float)auVar13._8_4_;
        local_c0[0][3] = (float)auVar13._12_4_;
        local_c0[0][4] = (float)auVar13._16_4_;
        local_c0[0][5] = (float)auVar13._20_4_;
        local_c0[0][6] = (float)auVar13._24_4_;
        local_c0[0][7] = (float)auVar13._28_4_;
        UnaryOp_x86_avx512_functor::unary_op_cos::func_pack8
                  ((unary_op_cos *)&local_d9,(__m256 *)local_c0);
        *(undefined1 (*) [32])pfVar7 = auVar13;
        pfVar7 = pfVar7 + 8;
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        local_c0[0]._0_16_ = *(undefined1 (*) [16])pfVar7;
        auVar28 = ZEXT856(*(ulong *)(pfVar7 + 2));
        afVar42 = UnaryOp_x86_avx512_functor::unary_op_cos::func_pack4
                            ((unary_op_cos *)&local_d9,(__m128 *)local_c0);
        auVar19._0_8_ = afVar42._0_8_;
        auVar19._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar7 = auVar19._0_16_;
        pfVar7 = pfVar7 + 4;
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = cosf(*pfVar7);
        *pfVar7 = fVar23;
        pfVar7 = pfVar7 + 1;
      }
    }
    break;
  case 0xb:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_d0 = 0;
    local_d8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_d8 = local_d0;
    }
    for (; local_d0 != local_d8; local_d0 = local_d0 + 1) {
      pfVar7 = (float *)(local_c8->cstep * local_d0 * local_c8->elemsize + (long)local_c8->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        afVar25 = *(__m512 *)pfVar7;
        local_c0[0] = afVar25;
        UnaryOp_x86_avx512_functor::unary_op_tan::func_pack16((unary_op_tan *)&local_d9,local_c0);
        *(__m512 *)pfVar7 = afVar25;
        pfVar7 = pfVar7 + 0x10;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])pfVar7;
        local_c0[0][0] = (float)auVar13._0_4_;
        local_c0[0][1] = (float)auVar13._4_4_;
        local_c0[0][2] = (float)auVar13._8_4_;
        local_c0[0][3] = (float)auVar13._12_4_;
        local_c0[0][4] = (float)auVar13._16_4_;
        local_c0[0][5] = (float)auVar13._20_4_;
        local_c0[0][6] = (float)auVar13._24_4_;
        local_c0[0][7] = (float)auVar13._28_4_;
        UnaryOp_x86_avx512_functor::unary_op_tan::func_pack8
                  ((unary_op_tan *)&local_d9,(__m256 *)local_c0);
        *(undefined1 (*) [32])pfVar7 = auVar13;
        pfVar7 = pfVar7 + 8;
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        local_c0[0]._0_16_ = *(undefined1 (*) [16])pfVar7;
        auVar28 = ZEXT856(*(ulong *)(pfVar7 + 2));
        afVar42 = UnaryOp_x86_avx512_functor::unary_op_tan::func_pack4
                            ((unary_op_tan *)&local_d9,(__m128 *)local_c0);
        auVar21._0_8_ = afVar42._0_8_;
        auVar21._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar7 = auVar21._0_16_;
        pfVar7 = pfVar7 + 4;
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = tanf(*pfVar7);
        *pfVar7 = fVar23;
        pfVar7 = pfVar7 + 1;
      }
    }
    break;
  case 0xc:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_d0 = 0;
    local_d8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_d8 = local_d0;
    }
    for (; local_d0 != local_d8; local_d0 = local_d0 + 1) {
      pfVar7 = (float *)(local_c8->cstep * local_d0 * local_c8->elemsize + (long)local_c8->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        afVar25 = *(__m512 *)pfVar7;
        local_c0[0] = afVar25;
        UnaryOp_x86_avx512_functor::unary_op_asin::func_pack16
                  ((__m512 *)&local_d9,(unary_op_asin *)local_c0,(__m512 *)opt);
        *(__m512 *)pfVar7 = afVar25;
        pfVar7 = pfVar7 + 0x10;
        opt = extraout_RDX_03;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])pfVar7;
        local_c0[0][0] = (float)auVar13._0_4_;
        local_c0[0][1] = (float)auVar13._4_4_;
        local_c0[0][2] = (float)auVar13._8_4_;
        local_c0[0][3] = (float)auVar13._12_4_;
        local_c0[0][4] = (float)auVar13._16_4_;
        local_c0[0][5] = (float)auVar13._20_4_;
        local_c0[0][6] = (float)auVar13._24_4_;
        local_c0[0][7] = (float)auVar13._28_4_;
        UnaryOp_x86_avx512_functor::unary_op_asin::func_pack8
                  ((__m256 *)&local_d9,(unary_op_asin *)local_c0,(__m256 *)opt);
        *(undefined1 (*) [32])pfVar7 = auVar13;
        pfVar7 = pfVar7 + 8;
        opt = extraout_RDX_04;
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        local_c0[0]._0_16_ = *(undefined1 (*) [16])pfVar7;
        auVar28 = ZEXT856(*(ulong *)(pfVar7 + 2));
        afVar42 = UnaryOp_x86_avx512_functor::unary_op_asin::func_pack4
                            ((unary_op_asin *)&local_d9,(__m128 *)local_c0);
        auVar18._0_8_ = afVar42._0_8_;
        auVar18._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar7 = auVar18._0_16_;
        pfVar7 = pfVar7 + 4;
        opt = extraout_RDX_05;
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = asinf(*pfVar7);
        *pfVar7 = fVar23;
        pfVar7 = pfVar7 + 1;
        opt = extraout_RDX_06;
      }
    }
    break;
  case 0xd:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_d0 = 0;
    local_d8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_d8 = local_d0;
    }
    for (; local_d0 != local_d8; local_d0 = local_d0 + 1) {
      pfVar7 = (float *)(local_c8->cstep * local_d0 * local_c8->elemsize + (long)local_c8->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        afVar25 = *(__m512 *)pfVar7;
        local_c0[0] = afVar25;
        UnaryOp_x86_avx512_functor::unary_op_acos::func_pack16
                  ((__m512 *)&local_d9,(unary_op_acos *)local_c0,(__m512 *)opt);
        *(__m512 *)pfVar7 = afVar25;
        pfVar7 = pfVar7 + 0x10;
        opt = extraout_RDX_07;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])pfVar7;
        local_c0[0][0] = (float)auVar13._0_4_;
        local_c0[0][1] = (float)auVar13._4_4_;
        local_c0[0][2] = (float)auVar13._8_4_;
        local_c0[0][3] = (float)auVar13._12_4_;
        local_c0[0][4] = (float)auVar13._16_4_;
        local_c0[0][5] = (float)auVar13._20_4_;
        local_c0[0][6] = (float)auVar13._24_4_;
        local_c0[0][7] = (float)auVar13._28_4_;
        UnaryOp_x86_avx512_functor::unary_op_acos::func_pack8
                  ((__m256 *)&local_d9,(unary_op_acos *)local_c0,(__m256 *)opt);
        *(undefined1 (*) [32])pfVar7 = auVar13;
        pfVar7 = pfVar7 + 8;
        opt = extraout_RDX_08;
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        local_c0[0]._0_16_ = *(undefined1 (*) [16])pfVar7;
        auVar28 = ZEXT856(*(ulong *)(pfVar7 + 2));
        afVar42 = UnaryOp_x86_avx512_functor::unary_op_acos::func_pack4
                            ((unary_op_acos *)&local_d9,(__m128 *)local_c0);
        auVar17._0_8_ = afVar42._0_8_;
        auVar17._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar7 = auVar17._0_16_;
        pfVar7 = pfVar7 + 4;
        opt = extraout_RDX_09;
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = acosf(*pfVar7);
        *pfVar7 = fVar23;
        pfVar7 = pfVar7 + 1;
        opt = extraout_RDX_10;
      }
    }
    break;
  case 0xe:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_d0 = 0;
    local_d8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_d8 = local_d0;
    }
    for (; local_d0 != local_d8; local_d0 = local_d0 + 1) {
      pfVar7 = (float *)(local_c8->cstep * local_d0 * local_c8->elemsize + (long)local_c8->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        afVar25 = *(__m512 *)pfVar7;
        local_c0[0] = afVar25;
        UnaryOp_x86_avx512_functor::unary_op_atan::func_pack16
                  ((__m512 *)&local_d9,(unary_op_atan *)local_c0,(__m512 *)opt);
        *(__m512 *)pfVar7 = afVar25;
        pfVar7 = pfVar7 + 0x10;
        opt = extraout_RDX;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])pfVar7;
        local_c0[0][0] = (float)auVar13._0_4_;
        local_c0[0][1] = (float)auVar13._4_4_;
        local_c0[0][2] = (float)auVar13._8_4_;
        local_c0[0][3] = (float)auVar13._12_4_;
        local_c0[0][4] = (float)auVar13._16_4_;
        local_c0[0][5] = (float)auVar13._20_4_;
        local_c0[0][6] = (float)auVar13._24_4_;
        local_c0[0][7] = (float)auVar13._28_4_;
        UnaryOp_x86_avx512_functor::unary_op_atan::func_pack8
                  ((__m256 *)&local_d9,(unary_op_atan *)local_c0,(__m256 *)opt);
        *(undefined1 (*) [32])pfVar7 = auVar13;
        pfVar7 = pfVar7 + 8;
        opt = extraout_RDX_00;
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        local_c0[0]._0_16_ = *(undefined1 (*) [16])pfVar7;
        auVar28 = ZEXT856(*(ulong *)(pfVar7 + 2));
        afVar42 = UnaryOp_x86_avx512_functor::unary_op_atan::func_pack4
                            ((unary_op_atan *)&local_d9,(__m128 *)local_c0);
        auVar16._0_8_ = afVar42._0_8_;
        auVar16._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar7 = auVar16._0_16_;
        pfVar7 = pfVar7 + 4;
        opt = extraout_RDX_01;
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = atanf(*pfVar7);
        *pfVar7 = fVar23;
        pfVar7 = pfVar7 + 1;
        opt = extraout_RDX_02;
      }
    }
    break;
  case 0xf:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar6 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar6;
    }
    auVar13._8_4_ = 0x3f800000;
    auVar13._0_8_ = 0x3f8000003f800000;
    auVar13._12_4_ = 0x3f800000;
    auVar13._16_4_ = 0x3f800000;
    auVar13._20_4_ = 0x3f800000;
    auVar13._24_4_ = 0x3f800000;
    auVar13._28_4_ = 0x3f800000;
    auVar11._8_4_ = 0x3f800000;
    auVar11._0_8_ = 0x3f8000003f800000;
    auVar11._12_4_ = 0x3f800000;
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        auVar15 = vrcp14ps_avx512f(*pauVar8);
        auVar16 = vmulps_avx512f((undefined1  [64])afVar4,auVar15);
        auVar17 = vfmsub213ps_avx512f(*pauVar8,auVar16,(undefined1  [64])afVar4);
        auVar15 = vfnmadd213ps_avx512f(auVar17,auVar15,auVar16);
        *pauVar8 = auVar15;
        pauVar8 = pauVar8 + 1;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar33 = vrcpps_avx(*(undefined1 (*) [32])*pauVar8);
        auVar36 = vfmsub213ps_fma(*(undefined1 (*) [32])*pauVar8,auVar33,auVar13);
        auVar36 = vfnmadd132ps_fma(ZEXT1632(auVar36),auVar33,auVar33);
        *(undefined1 (*) [32])*pauVar8 = ZEXT1632(auVar36);
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        auVar36 = vrcpps_avx(*(undefined1 (*) [16])*pauVar8);
        auVar37 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar8,auVar36,auVar11);
        auVar36 = vfnmadd132ps_fma(auVar37,auVar36,auVar36);
        *(undefined1 (*) [16])*pauVar8 = auVar36;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        *(float *)*pauVar8 = 1.0 / *(float *)*pauVar8;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 4);
      }
    }
    break;
  case 0x10:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_d0 = 0;
    local_d8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_d8 = local_d0;
    }
    for (; local_d0 != local_d8; local_d0 = local_d0 + 1) {
      pfVar7 = (float *)(local_c8->cstep * local_d0 * local_c8->elemsize + (long)local_c8->data);
      for (iVar10 = 0; iVar10 + 0xf < iVar9; iVar10 = iVar10 + 0x10) {
        afVar25 = *(__m512 *)pfVar7;
        local_c0[0] = afVar25;
        UnaryOp_x86_avx512_functor::unary_op_tanh::func_pack16(&local_d9,local_c0);
        *(__m512 *)pfVar7 = afVar25;
        pfVar7 = pfVar7 + 0x10;
      }
      for (; iVar10 + 7 < iVar9; iVar10 = iVar10 + 8) {
        auVar13 = *(undefined1 (*) [32])pfVar7;
        local_c0[0][0] = (float)auVar13._0_4_;
        local_c0[0][1] = (float)auVar13._4_4_;
        local_c0[0][2] = (float)auVar13._8_4_;
        local_c0[0][3] = (float)auVar13._12_4_;
        local_c0[0][4] = (float)auVar13._16_4_;
        local_c0[0][5] = (float)auVar13._20_4_;
        local_c0[0][6] = (float)auVar13._24_4_;
        local_c0[0][7] = (float)auVar13._28_4_;
        UnaryOp_x86_avx512_functor::unary_op_tanh::func_pack8(&local_d9,(__m256 *)local_c0);
        *(undefined1 (*) [32])pfVar7 = auVar13;
        pfVar7 = pfVar7 + 8;
      }
      for (; iVar10 + 3 < iVar9; iVar10 = iVar10 + 4) {
        local_c0[0]._0_16_ = *(undefined1 (*) [16])pfVar7;
        auVar28 = ZEXT856(*(ulong *)(pfVar7 + 2));
        afVar42 = UnaryOp_x86_avx512_functor::unary_op_tanh::func_pack4
                            (&local_d9,(__m128 *)local_c0);
        auVar15._0_8_ = afVar42._0_8_;
        auVar15._8_56_ = auVar28;
        *(undefined1 (*) [16])pfVar7 = auVar15._0_16_;
        pfVar7 = pfVar7 + 4;
      }
      for (; iVar10 < iVar9; iVar10 = iVar10 + 1) {
        fVar23 = tanhf(*pfVar7);
        *pfVar7 = fVar23;
        pfVar7 = pfVar7 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_avx512_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    return 0;
}